

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::inc_mhl(CPU *this)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  
  uVar1._0_1_ = this->regs->h;
  uVar1._1_1_ = this->regs->l;
  uVar6 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  iVar4 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)uVar6);
  bVar5 = this->regs->f & 0x10;
  bVar2 = bVar5 + 0x20;
  if ((~(byte)iVar4 & 0xf) != 0) {
    bVar2 = bVar5;
  }
  bVar3 = (byte)iVar4 + 1;
  bVar5 = bVar5 | 0xa0;
  if (bVar3 != 0) {
    bVar5 = bVar2;
  }
  this->regs->f = bVar5;
  (*this->mmu->_vptr_IMmu[2])(this->mmu,(ulong)uVar6,(ulong)bVar3);
  return 3;
}

Assistant:

int CPU::inc_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    uint8_t val = mmu.read_byte(addr);

    // CHECK
    inc_r8(val);

    mmu.write_byte(addr, val);
    return 3;
}